

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  float local_48;
  float local_44;
  int local_38;
  float width_or_weight;
  int n;
  bool save_ref_scale;
  ImGuiTableColumnSettings *column_settings;
  ImGuiTableColumn *column;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  table->IsSettingsDirty = false;
  pIVar2 = GImGui;
  if ((table->Flags & 0x20U) == 0) {
    column = (ImGuiTableColumn *)TableGetBoundSettings(table);
    if (column == (ImGuiTableColumn *)0x0) {
      column = (ImGuiTableColumn *)TableSettingsCreate(table->ID,table->ColumnsCount);
      iVar3 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr
                        (&pIVar2->SettingsTables,(ImGuiTableSettings *)column);
      table->SettingsOffset = iVar3;
    }
    *(char *)&(column->ClipRect).Max.y = (char)table->ColumnsCount;
    if ((column->ClipRect).Min.x != (float)table->ID) {
      __assert_fail("settings->ID == table->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                    ,0x2b94,"void ImGui::TableSaveSettings(ImGuiTable *)");
    }
    bVar1 = false;
    if ((int)*(char *)&(column->ClipRect).Max.y == table->ColumnsCount) {
      bVar1 = *(char *)&(column->ClipRect).Max.y <= *(char *)((long)&(column->ClipRect).Max.y + 1);
    }
    if (!bVar1) {
      __assert_fail("settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                    ,0x2b95,"void ImGui::TableSaveSettings(ImGuiTable *)");
    }
    column_settings = (ImGuiTableColumnSettings *)(table->Columns).Data;
    _n = ImGuiTableSettings::GetColumnSettings((ImGuiTableSettings *)column);
    bVar1 = false;
    (column->ClipRect).Min.y = 0.0;
    for (local_38 = 0; local_38 < table->ColumnsCount; local_38 = local_38 + 1) {
      if (((uint)column_settings[2].WidthOrWeight & 4) == 0) {
        local_44 = column_settings[4].WidthOrWeight;
      }
      else {
        local_44 = (float)column_settings[3].UserID;
      }
      _n->WidthOrWeight = local_44;
      _n->Index = (ImS8)local_38;
      _n->DisplayOrder = *(ImS8 *)((long)&column_settings[7].UserID + 3);
      _n->SortOrder = column_settings[7].field_0xb;
      _n->field_0xb = _n->field_0xb & 0xfc | *(byte *)&column_settings[8].WidthOrWeight & 3;
      _n->field_0xb =
           _n->field_0xb & 0xfb | (*(byte *)((long)&column_settings[7].WidthOrWeight + 2) & 1) << 2;
      _n->field_0xb =
           _n->field_0xb & 0xf7 | (((uint)column_settings[2].WidthOrWeight & 4) != 0) << 3;
      if (((uint)column_settings[2].WidthOrWeight & 4) == 0) {
        bVar1 = true;
      }
      if ((local_44 != column_settings[3].WidthOrWeight) ||
         (NAN(local_44) || NAN(column_settings[3].WidthOrWeight))) {
        (column->ClipRect).Min.y = (float)((uint)(column->ClipRect).Min.y | 1);
      }
      if (*(char *)((long)&column_settings[7].UserID + 3) != local_38) {
        (column->ClipRect).Min.y = (float)((uint)(column->ClipRect).Min.y | 2);
      }
      if (column_settings[7].field_0xb != -1) {
        (column->ClipRect).Min.y = (float)((uint)(column->ClipRect).Min.y | 8);
      }
      if ((bool)(*(byte *)((long)&column_settings[7].WidthOrWeight + 2) & 1) !=
          (((uint)column_settings[2].WidthOrWeight & 1) == 0)) {
        (column->ClipRect).Min.y = (float)((uint)(column->ClipRect).Min.y | 4);
      }
      column_settings = (ImGuiTableColumnSettings *)&column_settings[8].Index;
      _n = _n + 1;
    }
    (column->ClipRect).Min.y = (float)(table->Flags & (uint)(column->ClipRect).Min.y);
    if (bVar1) {
      local_48 = table->RefScale;
    }
    else {
      local_48 = 0.0;
    }
    (column->ClipRect).Max.x = local_48;
    MarkIniSettingsDirty();
  }
  return;
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImS8)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImS8)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsVisible = column->IsVisible;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsVisible != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}